

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ImGui::ShowAboutWindow(bool *p_open)

{
  bool bVar1;
  ImGuiID id;
  char *pcVar2;
  ImGuiIO_conflict *pIVar3;
  ImGuiStyle *pIVar4;
  float fVar5;
  char *local_48;
  char *local_40;
  ImVec2 local_34;
  ImVec2 child_size;
  bool copy_to_clipboard;
  ImGuiStyle *style;
  ImGuiIO_conflict *io;
  bool *p_open_local;
  
  bVar1 = Begin("About Dear ImGui",p_open,0x40);
  if (bVar1) {
    pcVar2 = GetVersion();
    Text("Dear ImGui %s",pcVar2);
    Separator();
    Text("By Omar Cornut and all Dear ImGui contributors.");
    Text("Dear ImGui is licensed under the MIT License, see LICENSE for more information.");
    Checkbox("Config/Build Information",&ShowAboutWindow::show_config_info);
    if ((ShowAboutWindow::show_config_info & 1U) != 0) {
      pIVar3 = GetIO();
      pIVar4 = GetStyle();
      ImVec2::ImVec2(&child_size,0.0,0.0);
      bVar1 = Button("Copy to clipboard",&child_size);
      fVar5 = GetTextLineHeightWithSpacing();
      ImVec2::ImVec2(&local_34,0.0,fVar5 * 18.0);
      id = GetID("cfg_infos");
      BeginChildFrame(id,&local_34,4);
      if (bVar1) {
        LogToClipboard(-1);
        LogText("```\n");
      }
      Text("Dear ImGui %s (%d)","1.85",0x4845);
      Separator();
      Text("sizeof(size_t): %d, sizeof(ImDrawIdx): %d, sizeof(ImDrawVert): %d",8,2,0x14);
      Text("define: __cplusplus=%d",0x3118f);
      Text("define: __linux__");
      Text("define: __GNUC__=%d",4);
      Text("define: __clang_version__=%s",
           "19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
          );
      Text("define: IMGUI_HAS_VIEWPORT");
      Text("define: IMGUI_HAS_DOCK");
      Separator();
      if (pIVar3->BackendPlatformName == (char *)0x0) {
        local_40 = "NULL";
      }
      else {
        local_40 = pIVar3->BackendPlatformName;
      }
      Text("io.BackendPlatformName: %s",local_40);
      if (pIVar3->BackendRendererName == (char *)0x0) {
        local_48 = "NULL";
      }
      else {
        local_48 = pIVar3->BackendRendererName;
      }
      Text("io.BackendRendererName: %s",local_48);
      Text("io.ConfigFlags: 0x%08X",(ulong)(uint)pIVar3->ConfigFlags);
      if ((pIVar3->ConfigFlags & 1U) != 0) {
        Text(" NavEnableKeyboard");
      }
      if ((pIVar3->ConfigFlags & 2U) != 0) {
        Text(" NavEnableGamepad");
      }
      if ((pIVar3->ConfigFlags & 4U) != 0) {
        Text(" NavEnableSetMousePos");
      }
      if ((pIVar3->ConfigFlags & 8U) != 0) {
        Text(" NavNoCaptureKeyboard");
      }
      if ((pIVar3->ConfigFlags & 0x10U) != 0) {
        Text(" NoMouse");
      }
      if ((pIVar3->ConfigFlags & 0x20U) != 0) {
        Text(" NoMouseCursorChange");
      }
      if ((pIVar3->ConfigFlags & 0x40U) != 0) {
        Text(" DockingEnable");
      }
      if ((pIVar3->ConfigFlags & 0x400U) != 0) {
        Text(" ViewportsEnable");
      }
      if ((pIVar3->ConfigFlags & 0x4000U) != 0) {
        Text(" DpiEnableScaleViewports");
      }
      if ((pIVar3->ConfigFlags & 0x8000U) != 0) {
        Text(" DpiEnableScaleFonts");
      }
      if ((pIVar3->MouseDrawCursor & 1U) != 0) {
        Text("io.MouseDrawCursor");
      }
      if ((pIVar3->ConfigViewportsNoAutoMerge & 1U) != 0) {
        Text("io.ConfigViewportsNoAutoMerge");
      }
      if ((pIVar3->ConfigViewportsNoTaskBarIcon & 1U) != 0) {
        Text("io.ConfigViewportsNoTaskBarIcon");
      }
      if ((pIVar3->ConfigViewportsNoDecoration & 1U) != 0) {
        Text("io.ConfigViewportsNoDecoration");
      }
      if ((pIVar3->ConfigViewportsNoDefaultParent & 1U) != 0) {
        Text("io.ConfigViewportsNoDefaultParent");
      }
      if ((pIVar3->ConfigDockingNoSplit & 1U) != 0) {
        Text("io.ConfigDockingNoSplit");
      }
      if ((pIVar3->ConfigDockingWithShift & 1U) != 0) {
        Text("io.ConfigDockingWithShift");
      }
      if ((pIVar3->ConfigDockingAlwaysTabBar & 1U) != 0) {
        Text("io.ConfigDockingAlwaysTabBar");
      }
      if ((pIVar3->ConfigDockingTransparentPayload & 1U) != 0) {
        Text("io.ConfigDockingTransparentPayload");
      }
      if ((pIVar3->ConfigMacOSXBehaviors & 1U) != 0) {
        Text("io.ConfigMacOSXBehaviors");
      }
      if ((pIVar3->ConfigInputTextCursorBlink & 1U) != 0) {
        Text("io.ConfigInputTextCursorBlink");
      }
      if ((pIVar3->ConfigWindowsResizeFromEdges & 1U) != 0) {
        Text("io.ConfigWindowsResizeFromEdges");
      }
      if ((pIVar3->ConfigWindowsMoveFromTitleBarOnly & 1U) != 0) {
        Text("io.ConfigWindowsMoveFromTitleBarOnly");
      }
      if (0.0 <= pIVar3->ConfigMemoryCompactTimer) {
        Text("io.ConfigMemoryCompactTimer = %.1f",(double)pIVar3->ConfigMemoryCompactTimer);
      }
      Text("io.BackendFlags: 0x%08X",(ulong)(uint)pIVar3->BackendFlags);
      if ((pIVar3->BackendFlags & 1U) != 0) {
        Text(" HasGamepad");
      }
      if ((pIVar3->BackendFlags & 2U) != 0) {
        Text(" HasMouseCursors");
      }
      if ((pIVar3->BackendFlags & 4U) != 0) {
        Text(" HasSetMousePos");
      }
      if ((pIVar3->BackendFlags & 0x400U) != 0) {
        Text(" PlatformHasViewports");
      }
      if ((pIVar3->BackendFlags & 0x800U) != 0) {
        Text(" HasMouseHoveredViewport");
      }
      if ((pIVar3->BackendFlags & 8U) != 0) {
        Text(" RendererHasVtxOffset");
      }
      if ((pIVar3->BackendFlags & 0x1000U) != 0) {
        Text(" RendererHasViewports");
      }
      Separator();
      Text("io.Fonts: %d fonts, Flags: 0x%08X, TexSize: %d,%d",
           (ulong)(uint)(pIVar3->Fonts->Fonts).Size,(ulong)(uint)pIVar3->Fonts->Flags,
           (ulong)(uint)pIVar3->Fonts->TexWidth,(ulong)(uint)pIVar3->Fonts->TexHeight);
      Text("io.DisplaySize: %.2f,%.2f",(double)(pIVar3->DisplaySize).x,
           (double)(pIVar3->DisplaySize).y);
      Text("io.DisplayFramebufferScale: %.2f,%.2f",(double)(pIVar3->DisplayFramebufferScale).x,
           (double)(pIVar3->DisplayFramebufferScale).y);
      Separator();
      Text("style.WindowPadding: %.2f,%.2f",(double)(pIVar4->WindowPadding).x,
           (double)(pIVar4->WindowPadding).y);
      Text("style.WindowBorderSize: %.2f",(double)pIVar4->WindowBorderSize);
      Text("style.FramePadding: %.2f,%.2f",(double)(pIVar4->FramePadding).x,
           (double)(pIVar4->FramePadding).y);
      Text("style.FrameRounding: %.2f",(double)pIVar4->FrameRounding);
      Text("style.FrameBorderSize: %.2f",(double)pIVar4->FrameBorderSize);
      Text("style.ItemSpacing: %.2f,%.2f",(double)(pIVar4->ItemSpacing).x,
           (double)(pIVar4->ItemSpacing).y);
      Text("style.ItemInnerSpacing: %.2f,%.2f",(double)(pIVar4->ItemInnerSpacing).x,
           (double)(pIVar4->ItemInnerSpacing).y);
      if (bVar1) {
        LogText("\n```\n");
        LogFinish();
      }
      EndChildFrame();
    }
    End();
  }
  else {
    End();
  }
  return;
}

Assistant:

void ImGui::ShowAboutWindow(bool* p_open)
{
    if (!ImGui::Begin("About Dear ImGui", p_open, ImGuiWindowFlags_AlwaysAutoResize))
    {
        ImGui::End();
        return;
    }
    ImGui::Text("Dear ImGui %s", ImGui::GetVersion());
    ImGui::Separator();
    ImGui::Text("By Omar Cornut and all Dear ImGui contributors.");
    ImGui::Text("Dear ImGui is licensed under the MIT License, see LICENSE for more information.");

    static bool show_config_info = false;
    ImGui::Checkbox("Config/Build Information", &show_config_info);
    if (show_config_info)
    {
        ImGuiIO& io = ImGui::GetIO();
        ImGuiStyle& style = ImGui::GetStyle();

        bool copy_to_clipboard = ImGui::Button("Copy to clipboard");
        ImVec2 child_size = ImVec2(0, ImGui::GetTextLineHeightWithSpacing() * 18);
        ImGui::BeginChildFrame(ImGui::GetID("cfg_infos"), child_size, ImGuiWindowFlags_NoMove);
        if (copy_to_clipboard)
        {
            ImGui::LogToClipboard();
            ImGui::LogText("```\n"); // Back quotes will make text appears without formatting when pasting on GitHub
        }

        ImGui::Text("Dear ImGui %s (%d)", IMGUI_VERSION, IMGUI_VERSION_NUM);
        ImGui::Separator();
        ImGui::Text("sizeof(size_t): %d, sizeof(ImDrawIdx): %d, sizeof(ImDrawVert): %d", (int)sizeof(size_t), (int)sizeof(ImDrawIdx), (int)sizeof(ImDrawVert));
        ImGui::Text("define: __cplusplus=%d", (int)__cplusplus);
#ifdef IMGUI_DISABLE_OBSOLETE_FUNCTIONS
        ImGui::Text("define: IMGUI_DISABLE_OBSOLETE_FUNCTIONS");
#endif
#ifdef IMGUI_DISABLE_WIN32_DEFAULT_CLIPBOARD_FUNCTIONS
        ImGui::Text("define: IMGUI_DISABLE_WIN32_DEFAULT_CLIPBOARD_FUNCTIONS");
#endif
#ifdef IMGUI_DISABLE_WIN32_DEFAULT_IME_FUNCTIONS
        ImGui::Text("define: IMGUI_DISABLE_WIN32_DEFAULT_IME_FUNCTIONS");
#endif
#ifdef IMGUI_DISABLE_WIN32_FUNCTIONS
        ImGui::Text("define: IMGUI_DISABLE_WIN32_FUNCTIONS");
#endif
#ifdef IMGUI_DISABLE_DEFAULT_FORMAT_FUNCTIONS
        ImGui::Text("define: IMGUI_DISABLE_DEFAULT_FORMAT_FUNCTIONS");
#endif
#ifdef IMGUI_DISABLE_DEFAULT_MATH_FUNCTIONS
        ImGui::Text("define: IMGUI_DISABLE_DEFAULT_MATH_FUNCTIONS");
#endif
#ifdef IMGUI_DISABLE_DEFAULT_FILE_FUNCTIONS
        ImGui::Text("define: IMGUI_DISABLE_DEFAULT_FILE_FUNCTIONS");
#endif
#ifdef IMGUI_DISABLE_FILE_FUNCTIONS
        ImGui::Text("define: IMGUI_DISABLE_FILE_FUNCTIONS");
#endif
#ifdef IMGUI_DISABLE_DEFAULT_ALLOCATORS
        ImGui::Text("define: IMGUI_DISABLE_DEFAULT_ALLOCATORS");
#endif
#ifdef IMGUI_USE_BGRA_PACKED_COLOR
        ImGui::Text("define: IMGUI_USE_BGRA_PACKED_COLOR");
#endif
#ifdef _WIN32
        ImGui::Text("define: _WIN32");
#endif
#ifdef _WIN64
        ImGui::Text("define: _WIN64");
#endif
#ifdef __linux__
        ImGui::Text("define: __linux__");
#endif
#ifdef __APPLE__
        ImGui::Text("define: __APPLE__");
#endif
#ifdef _MSC_VER
        ImGui::Text("define: _MSC_VER=%d", _MSC_VER);
#endif
#ifdef _MSVC_LANG
        ImGui::Text("define: _MSVC_LANG=%d", (int)_MSVC_LANG);
#endif
#ifdef __MINGW32__
        ImGui::Text("define: __MINGW32__");
#endif
#ifdef __MINGW64__
        ImGui::Text("define: __MINGW64__");
#endif
#ifdef __GNUC__
        ImGui::Text("define: __GNUC__=%d", (int)__GNUC__);
#endif
#ifdef __clang_version__
        ImGui::Text("define: __clang_version__=%s", __clang_version__);
#endif
#ifdef IMGUI_HAS_VIEWPORT
        ImGui::Text("define: IMGUI_HAS_VIEWPORT");
#endif
#ifdef IMGUI_HAS_DOCK
        ImGui::Text("define: IMGUI_HAS_DOCK");
#endif
        ImGui::Separator();
        ImGui::Text("io.BackendPlatformName: %s", io.BackendPlatformName ? io.BackendPlatformName : "NULL");
        ImGui::Text("io.BackendRendererName: %s", io.BackendRendererName ? io.BackendRendererName : "NULL");
        ImGui::Text("io.ConfigFlags: 0x%08X", io.ConfigFlags);
        if (io.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard)        ImGui::Text(" NavEnableKeyboard");
        if (io.ConfigFlags & ImGuiConfigFlags_NavEnableGamepad)         ImGui::Text(" NavEnableGamepad");
        if (io.ConfigFlags & ImGuiConfigFlags_NavEnableSetMousePos)     ImGui::Text(" NavEnableSetMousePos");
        if (io.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard)     ImGui::Text(" NavNoCaptureKeyboard");
        if (io.ConfigFlags & ImGuiConfigFlags_NoMouse)                  ImGui::Text(" NoMouse");
        if (io.ConfigFlags & ImGuiConfigFlags_NoMouseCursorChange)      ImGui::Text(" NoMouseCursorChange");
        if (io.ConfigFlags & ImGuiConfigFlags_DockingEnable)            ImGui::Text(" DockingEnable");
        if (io.ConfigFlags & ImGuiConfigFlags_ViewportsEnable)          ImGui::Text(" ViewportsEnable");
        if (io.ConfigFlags & ImGuiConfigFlags_DpiEnableScaleViewports)  ImGui::Text(" DpiEnableScaleViewports");
        if (io.ConfigFlags & ImGuiConfigFlags_DpiEnableScaleFonts)      ImGui::Text(" DpiEnableScaleFonts");
        if (io.MouseDrawCursor)                                         ImGui::Text("io.MouseDrawCursor");
        if (io.ConfigViewportsNoAutoMerge)                              ImGui::Text("io.ConfigViewportsNoAutoMerge");
        if (io.ConfigViewportsNoTaskBarIcon)                            ImGui::Text("io.ConfigViewportsNoTaskBarIcon");
        if (io.ConfigViewportsNoDecoration)                             ImGui::Text("io.ConfigViewportsNoDecoration");
        if (io.ConfigViewportsNoDefaultParent)                          ImGui::Text("io.ConfigViewportsNoDefaultParent");
        if (io.ConfigDockingNoSplit)                                    ImGui::Text("io.ConfigDockingNoSplit");
        if (io.ConfigDockingWithShift)                                  ImGui::Text("io.ConfigDockingWithShift");
        if (io.ConfigDockingAlwaysTabBar)                               ImGui::Text("io.ConfigDockingAlwaysTabBar");
        if (io.ConfigDockingTransparentPayload)                         ImGui::Text("io.ConfigDockingTransparentPayload");
        if (io.ConfigMacOSXBehaviors)                                   ImGui::Text("io.ConfigMacOSXBehaviors");
        if (io.ConfigInputTextCursorBlink)                              ImGui::Text("io.ConfigInputTextCursorBlink");
        if (io.ConfigWindowsResizeFromEdges)                            ImGui::Text("io.ConfigWindowsResizeFromEdges");
        if (io.ConfigWindowsMoveFromTitleBarOnly)                       ImGui::Text("io.ConfigWindowsMoveFromTitleBarOnly");
        if (io.ConfigMemoryCompactTimer >= 0.0f)                        ImGui::Text("io.ConfigMemoryCompactTimer = %.1f", io.ConfigMemoryCompactTimer);
        ImGui::Text("io.BackendFlags: 0x%08X", io.BackendFlags);
        if (io.BackendFlags & ImGuiBackendFlags_HasGamepad)             ImGui::Text(" HasGamepad");
        if (io.BackendFlags & ImGuiBackendFlags_HasMouseCursors)        ImGui::Text(" HasMouseCursors");
        if (io.BackendFlags & ImGuiBackendFlags_HasSetMousePos)         ImGui::Text(" HasSetMousePos");
        if (io.BackendFlags & ImGuiBackendFlags_PlatformHasViewports)   ImGui::Text(" PlatformHasViewports");
        if (io.BackendFlags & ImGuiBackendFlags_HasMouseHoveredViewport)ImGui::Text(" HasMouseHoveredViewport");
        if (io.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)   ImGui::Text(" RendererHasVtxOffset");
        if (io.BackendFlags & ImGuiBackendFlags_RendererHasViewports)   ImGui::Text(" RendererHasViewports");
        ImGui::Separator();
        ImGui::Text("io.Fonts: %d fonts, Flags: 0x%08X, TexSize: %d,%d", io.Fonts->Fonts.Size, io.Fonts->Flags, io.Fonts->TexWidth, io.Fonts->TexHeight);
        ImGui::Text("io.DisplaySize: %.2f,%.2f", io.DisplaySize.x, io.DisplaySize.y);
        ImGui::Text("io.DisplayFramebufferScale: %.2f,%.2f", io.DisplayFramebufferScale.x, io.DisplayFramebufferScale.y);
        ImGui::Separator();
        ImGui::Text("style.WindowPadding: %.2f,%.2f", style.WindowPadding.x, style.WindowPadding.y);
        ImGui::Text("style.WindowBorderSize: %.2f", style.WindowBorderSize);
        ImGui::Text("style.FramePadding: %.2f,%.2f", style.FramePadding.x, style.FramePadding.y);
        ImGui::Text("style.FrameRounding: %.2f", style.FrameRounding);
        ImGui::Text("style.FrameBorderSize: %.2f", style.FrameBorderSize);
        ImGui::Text("style.ItemSpacing: %.2f,%.2f", style.ItemSpacing.x, style.ItemSpacing.y);
        ImGui::Text("style.ItemInnerSpacing: %.2f,%.2f", style.ItemInnerSpacing.x, style.ItemInnerSpacing.y);

        if (copy_to_clipboard)
        {
            ImGui::LogText("\n```\n");
            ImGui::LogFinish();
        }
        ImGui::EndChildFrame();
    }
    ImGui::End();
}